

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTextureOrNull
          (TextureParameterDictionary *this,string *name,SpectrumType spectrumType,Allocator alloc)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pcVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  undefined1 (*pauVar3) [16];
  undefined1 auVar4 [16];
  bool bVar5;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  *pTVar6;
  const_iterator cVar7;
  RGBConstantTexture *pRVar8;
  ParameterDictionary *pPVar9;
  ulong uVar10;
  undefined4 in_register_00000014;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  long lVar11;
  char *pcVar12;
  long *in_R8;
  pointer pcVar13;
  SpectrumHandle s;
  Allocator alloc_local;
  undefined8 local_38;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          CONCAT44(in_register_00000014,spectrumType);
  pcVar1 = (name->_M_dataplus)._M_p;
  lVar2 = *(long *)(pcVar1 + 0x58);
  pcVar13 = pcVar1 + 0x10;
  if (*(pointer *)(pcVar1 + 8) != (pointer)0x0) {
    pcVar13 = *(pointer *)(pcVar1 + 8);
  }
  lVar11 = 0;
  do {
    if (lVar2 << 3 == lVar11) {
      this->dict = (ParameterDictionary *)0x0;
      return (SpectrumTextureHandle)
             (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              )this;
    }
    __lhs_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (pcVar13 + lVar11);
    __lhs = __lhs_00 + 1;
    bVar5 = std::operator!=(__lhs,__rhs);
    if (!bVar5) {
      bVar5 = std::operator==(__lhs_00,"texture");
      if (bVar5) {
        if (__lhs_00[4].field_2._M_allocated_capacity != 1) {
          if (__lhs_00[4].field_2._M_allocated_capacity == 0) {
            pcVar12 = "No texture name provided for parameter \"%s\".";
          }
          else {
            pcVar12 = "More than one texture name provided for parameter \"%s\".";
          }
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)(__lhs_00 + 2),pcVar12,__rhs);
        }
        __lhs_00[5].field_2._M_local_buf[8] = '\x01';
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
                        *)(name->field_2)._M_allocated_capacity,
                       (key_type *)__lhs_00[4]._M_dataplus._M_p);
        if (cVar7._M_node == (_Base_ptr)((name->field_2)._M_allocated_capacity + 8)) {
          ErrorExit<std::__cxx11::string_const&,std::__cxx11::string_const&>
                    ((FileLoc *)(__lhs_00 + 2),
                     "Couldn\'t find spectrum texture named \"%s\" for parameter \"%s\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __lhs_00[4]._M_dataplus._M_p,__lhs);
        }
        pPVar9 = *(ParameterDictionary **)(cVar7._M_node + 2);
LAB_00281067:
        this->dict = pPVar9;
        return (SpectrumTextureHandle)
               (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                )this;
      }
      bVar5 = std::operator==(__lhs_00,"rgb");
      if (bVar5) {
        if (__lhs_00[3].field_2._M_allocated_capacity == 3) {
          __lhs_00[5].field_2._M_local_buf[8] = '\x01';
          pauVar3 = (undefined1 (*) [16])__lhs_00[3]._M_dataplus._M_p;
          auVar4 = vcvtpd2ps_avx(*pauVar3);
          s.
          super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
          .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                   )vmovlps_avx(auVar4);
          if (((0.0 <= auVar4._0_4_) && (auVar4 = vmovshdup_avx(auVar4), 0.0 <= auVar4._0_4_)) &&
             (0.0 <= (float)*(double *)pauVar3[1])) {
            if ((int)alloc.memoryResource == 0) {
              pRVar8 = (RGBConstantTexture *)
                       pstd::pmr::polymorphic_allocator<std::byte>::
                       new_object<pbrt::RGBReflectanceConstantTexture,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                                 (&alloc_local,*(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60),
                                  (RGB *)&s);
              uVar10 = 0x2000000000000;
            }
            else {
              if ((int)alloc.memoryResource != 1) {
                LogFatal<char_const(&)[42]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                           ,0x349,"Check failed: %s",
                           (char (*) [42])"spectrumType == SpectrumType::Reflectance");
              }
              pRVar8 = pstd::pmr::polymorphic_allocator<std::byte>::
                       new_object<pbrt::RGBConstantTexture,pbrt::RGBColorSpace_const&,pbrt::RGB&>
                                 (&alloc_local,*(RGBColorSpace **)((name->_M_dataplus)._M_p + 0x60),
                                  (RGB *)&s);
              uVar10 = 0x1000000000000;
            }
            pPVar9 = (ParameterDictionary *)((ulong)pRVar8 | uVar10);
            goto LAB_00281067;
          }
          pcVar12 = "Negative value provided for \"rgb\" parameter \"%s\".";
        }
        else {
          pcVar12 = "Didn\'t find three values for \"rgb\" parameter \"%s\".";
        }
        ErrorExit<std::__cxx11::string_const&>((FileLoc *)(__lhs_00 + 2),pcVar12,__lhs);
      }
      bVar5 = std::operator==(__lhs_00,"spectrum");
      if ((bVar5) || (bVar5 = std::operator==(__lhs_00,"blackbody"), bVar5)) {
        local_38 = 0;
        GetOneSpectrum((TextureParameterDictionary *)&s,name,(SpectrumHandle *)__rhs,
                       (SpectrumType)&local_38,
                       (memory_resource *)((ulong)alloc.memoryResource & 0xffffffff));
        if (s.
            super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
            .bits != 0) {
          pTVar6 = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                    *)(**(code **)(*in_R8 + 0x10))(in_R8,8);
          pTVar6->bits = (uintptr_t)
                         s.
                         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                         .bits;
          this->dict = (ParameterDictionary *)((ulong)pTVar6 | 0x7000000000000);
          return (SpectrumTextureHandle)
                 (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                  )this;
        }
        LogFatal<char_const(&)[13]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/paramdict.cpp"
                   ,0x34f,"Check failed: %s",(char (*) [13])"s != nullptr");
      }
    }
    lVar11 = lVar11 + 8;
  } while( true );
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTextureOrNull(
    const std::string &name, SpectrumType spectrumType, Allocator alloc) const {
    for (const ParsedParameter *p : dict->params) {
        if (p->name != name)
            continue;

        if (p->type == "texture") {
            if (p->strings.empty())
                ErrorExit(&p->loc, "No texture name provided for parameter \"%s\".",
                          name);
            if (p->strings.size() != 1)
                ErrorExit(&p->loc,
                          "More than one texture name provided for parameter \"%s\".",
                          name);

            p->lookedUp = true;
            auto iter = spectrumTextures->find(p->strings[0]);
            if (iter != spectrumTextures->end())
                return iter->second;

            ErrorExit(&p->loc,
                      R"(Couldn't find spectrum texture named "%s" for parameter "%s")",
                      p->strings[0], p->name);
        } else if (p->type == "rgb") {
            if (p->numbers.size() != 3)
                ErrorExit(&p->loc,
                          "Didn't find three values for \"rgb\" parameter \"%s\".",
                          p->name);
            p->lookedUp = true;

            RGB rgb(p->numbers[0], p->numbers[1], p->numbers[2]);
            if (rgb.r < 0 || rgb.g < 0 || rgb.b < 0)
                ErrorExit(&p->loc,
                          "Negative value provided for \"rgb\" parameter \"%s\".",
                          p->name);
            if (spectrumType == SpectrumType::General)
                return alloc.new_object<RGBConstantTexture>(*dict->ColorSpace(), rgb);
            else {
                CHECK(spectrumType == SpectrumType::Reflectance);
                return alloc.new_object<RGBReflectanceConstantTexture>(
                    *dict->ColorSpace(), rgb);
            }
        } else if (p->type == "spectrum" || p->type == "blackbody") {
            SpectrumHandle s = GetOneSpectrum(name, nullptr, spectrumType, alloc);
            CHECK(s != nullptr);
            return alloc.new_object<SpectrumConstantTexture>(s);
        }
    }

    return nullptr;
}